

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O1

void __thiscall deqp::egl::ColorClearThread::run(ColorClearThread *this)

{
  pointer pCVar1;
  long lVar2;
  
  pCVar1 = (this->m_packets->
           super__Vector_base<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (this->m_packets->
                super__Vector_base<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>)
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      deSemaphore_decrement(((pCVar1->wait).m_ptr)->m_semaphore);
      (*this->m_egl->_vptr_Library[0x27])
                (this->m_egl,this->m_display,this->m_surface,this->m_surface,this->m_context);
      lVar2 = 0;
      do {
        renderClear(this->m_api,this->m_funcs,(ClearOp *)((long)&pCVar1->clears[0].x + lVar2));
        lVar2 = lVar2 + 0x14;
      } while (lVar2 == 0x14);
      finish(this->m_api,this->m_funcs);
      (*this->m_egl->_vptr_Library[0x27])(this->m_egl,this->m_display,0,0,0);
      deSemaphore_increment(((pCVar1->signal).m_ptr)->m_semaphore);
      pCVar1 = pCVar1 + 1;
    } while (pCVar1 != (this->m_packets->
                       super__Vector_base<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void run (void)
	{
		for (std::vector<ClearPacket>::const_iterator packetIter = m_packets.begin(); packetIter != m_packets.end(); packetIter++)
		{
			// Wait until it is our turn.
			packetIter->wait->decrement();

			// Acquire context.
			m_egl.makeCurrent(m_display, m_surface, m_surface, m_context);

			// Execute clears.
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(packetIter->clears); ndx++)
				renderClear(m_api, m_funcs, packetIter->clears[ndx]);

			finish(m_api, m_funcs);
			// Release context.
			m_egl.makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);

			// Signal completion.
			packetIter->signal->increment();
		}
	}